

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O2

int mbedtls_x509_crl_parse_der(mbedtls_x509_crl *chain,uchar *buf,size_t buflen)

{
  int *val;
  size_t *len_00;
  size_t __n;
  int iVar1;
  int iVar2;
  mbedtls_x509_crl *__s;
  byte *pbVar3;
  mbedtls_x509_crl_entry *pmVar4;
  mbedtls_x509_crl *crl;
  byte *pbVar5;
  mbedtls_x509_crl_entry *pmVar6;
  byte *local_b0;
  size_t local_a8;
  size_t len;
  size_t entry_len;
  byte *local_90;
  mbedtls_x509_buf sig_params1;
  size_t local_70;
  mbedtls_x509_buf sig_oid2;
  mbedtls_x509_buf sig_params2;
  
  if (buf == (uchar *)0x0 || chain == (mbedtls_x509_crl *)0x0) {
    return -0x2800;
  }
  sig_params1.tag = 0;
  sig_params1._4_4_ = 0;
  sig_params1.len = 0;
  sig_params1.p = (uchar *)0x0;
  sig_params2.tag = 0;
  sig_params2._4_4_ = 0;
  sig_params2.len = 0;
  sig_params2.p = (uchar *)0x0;
  sig_oid2.tag = 0;
  sig_oid2._4_4_ = 0;
  sig_oid2.len = 0;
  sig_oid2.p = (uchar *)0x0;
  do {
    crl = chain;
    if (crl->version == 0) goto LAB_0011f623;
    chain = crl->next;
  } while (crl->next != (mbedtls_x509_crl *)0x0);
  __s = (mbedtls_x509_crl *)calloc(1,0x1a0);
  crl->next = __s;
  if (__s == (mbedtls_x509_crl *)0x0) {
    mbedtls_x509_crl_free(crl);
  }
  else {
    memset(__s,0,0x1a0);
    crl = crl->next;
LAB_0011f623:
    iVar2 = -0x2180;
    if (buflen == 0) {
      return -0x2180;
    }
    pbVar3 = (byte *)calloc(1,buflen);
    if (pbVar3 != (byte *)0x0) {
      local_b0 = pbVar3;
      memcpy(pbVar3,buf,buflen);
      (crl->raw).p = pbVar3;
      (crl->raw).len = buflen;
      pbVar3 = pbVar3 + buflen;
      iVar1 = mbedtls_asn1_get_tag(&local_b0,pbVar3,&len,0x30);
      if (iVar1 != 0) goto LAB_0011f677;
      if (len != (long)pbVar3 - (long)local_b0) goto LAB_0011fae3;
      (crl->tbs).p = local_b0;
      iVar2 = mbedtls_asn1_get_tag(&local_b0,pbVar3,&len,0x30);
      if (iVar2 != 0) {
LAB_0011f6d5:
        mbedtls_x509_crl_free(crl);
        return iVar2 + -0x2180;
      }
      pbVar3 = local_b0 + len;
      (crl->tbs).len = (long)pbVar3 - (long)(crl->tbs).p;
      val = &crl->version;
      iVar2 = mbedtls_asn1_get_int(&local_b0,pbVar3,val);
      if (iVar2 != 0) {
        if (iVar2 == -0x62) {
          *val = 0;
        }
        else {
          iVar2 = iVar2 + -0x2200;
          if (iVar2 != 0) goto LAB_0011f677;
        }
      }
      iVar2 = mbedtls_x509_get_alg(&local_b0,pbVar3,&crl->sig_oid,&sig_params1);
      if (iVar2 != 0) goto LAB_0011f677;
      if (1 < (uint)*val) {
        mbedtls_x509_crl_free(crl);
        return -0x2580;
      }
      crl->version = *val + 1;
      iVar2 = mbedtls_x509_get_sig_alg
                        (&crl->sig_oid,&sig_params1,&crl->sig_md,&crl->sig_pk,&crl->sig_opts);
      if (iVar2 != 0) {
        mbedtls_x509_crl_free(crl);
        return -0x2600;
      }
      (crl->issuer_raw).p = local_b0;
      iVar2 = mbedtls_asn1_get_tag(&local_b0,pbVar3,&len,0x30);
      if (iVar2 != 0) goto LAB_0011f6d5;
      iVar2 = mbedtls_x509_get_name(&local_b0,local_b0 + len,&crl->issuer);
      if (iVar2 == 0) {
        (crl->issuer_raw).len = (long)local_b0 - (long)(crl->issuer_raw).p;
        iVar2 = mbedtls_x509_get_time(&local_b0,pbVar3,&crl->this_update);
        if ((iVar2 == 0) &&
           (((iVar2 = mbedtls_x509_get_time(&local_b0,pbVar3,&crl->next_update), iVar2 == -0x2462 ||
             (iVar2 == -0x2460)) || (iVar2 == 0)))) {
          if ((local_b0 == pbVar3) ||
             (iVar2 = mbedtls_asn1_get_tag(&local_b0,pbVar3,&entry_len,0x30), iVar2 == -0x62)) {
LAB_0011f9cf:
            if ((*val == 2) &&
               (iVar2 = mbedtls_x509_get_ext(&local_b0,pbVar3,&crl->crl_ext,0), iVar2 != -0x62)) {
              if (iVar2 == 0) {
                pbVar5 = local_b0;
                do {
                  if (pbVar3 <= pbVar5) {
                    iVar2 = -0x2566;
                    if (pbVar5 != pbVar3) goto LAB_0011f677;
                    goto LAB_0011fadc;
                  }
                  entry_len._0_4_ = 0;
                  iVar2 = mbedtls_asn1_get_tag(&local_b0,pbVar3,&local_a8,0x30);
                  if (iVar2 != 0) {
LAB_0011faba:
                    iVar2 = iVar2 + -0x2500;
                    goto LAB_0011fad4;
                  }
                  pbVar5 = local_b0 + local_a8;
                  iVar2 = mbedtls_asn1_get_tag(&local_b0,pbVar5,&local_a8,6);
                  if (iVar2 != 0) goto LAB_0011faba;
                  local_b0 = local_b0 + local_a8;
                  iVar2 = mbedtls_asn1_get_bool(&local_b0,pbVar5,(int *)&entry_len);
                  if (((iVar2 != -0x62) && (iVar2 != 0)) ||
                     (iVar2 = mbedtls_asn1_get_tag(&local_b0,pbVar5,&local_a8,4), iVar2 != 0))
                  goto LAB_0011faba;
                  local_b0 = local_b0 + local_a8;
                  if (local_b0 != pbVar5) {
                    iVar2 = -0x2566;
                    goto LAB_0011fad4;
                  }
                } while ((int)entry_len == 0);
                iVar2 = -0x2562;
                goto LAB_0011f677;
              }
LAB_0011fad4:
              if (iVar2 != 0) goto LAB_0011f677;
            }
LAB_0011fadc:
            if (local_b0 != pbVar3) {
LAB_0011fae3:
              mbedtls_x509_crl_free(crl);
              return -0x21e6;
            }
            pbVar3 = (crl->raw).p + (crl->raw).len;
            iVar2 = mbedtls_x509_get_alg(&local_b0,pbVar3,&sig_oid2,&sig_params2);
            if (iVar2 == 0) {
              __n = (crl->sig_oid).len;
              if (((__n != sig_oid2.len) ||
                  (iVar2 = bcmp((crl->sig_oid).p,sig_oid2.p,__n), iVar2 != 0)) ||
                 ((sig_params1.len != sig_params2.len ||
                  ((sig_params1.len != 0 &&
                   (iVar2 = bcmp(sig_params1.p,sig_params2.p,sig_params1.len), iVar2 != 0)))))) {
                mbedtls_x509_crl_free(crl);
                return -0x2680;
              }
              iVar2 = mbedtls_x509_get_sig(&local_b0,pbVar3,&crl->sig);
              if (iVar2 == 0) {
                if (local_b0 == pbVar3) {
                  return 0;
                }
                goto LAB_0011fae3;
              }
            }
          }
          else if (iVar2 == 0) {
            local_90 = local_b0 + CONCAT44(entry_len._4_4_,(int)entry_len);
            pbVar5 = local_b0;
            pmVar6 = &crl->entry;
            do {
              do {
                if (local_90 <= pbVar5) goto LAB_0011f9cf;
                iVar2 = mbedtls_asn1_get_tag(&local_b0,local_90,&local_70,0x30);
                if (iVar2 != 0) goto LAB_0011f677;
                (pmVar6->raw).tag = (uint)*local_b0;
                (pmVar6->raw).p = local_b0;
                (pmVar6->raw).len = local_70;
                pbVar5 = local_b0 + local_70;
                iVar2 = mbedtls_x509_get_serial(&local_b0,pbVar5,&pmVar6->serial);
                if ((iVar2 != 0) ||
                   (iVar2 = mbedtls_x509_get_time(&local_b0,pbVar5,&pmVar6->revocation_date),
                   iVar2 != 0)) goto LAB_0011f677;
                local_a8 = 0;
                if (local_b0 < pbVar5) {
                  (pmVar6->entry_ext).tag = (uint)*local_b0;
                  (pmVar6->entry_ext).p = local_b0;
                  len_00 = &(pmVar6->entry_ext).len;
                  iVar2 = mbedtls_asn1_get_tag(&local_b0,pbVar5,len_00,0x30);
                  if (iVar2 == 0) {
                    pbVar5 = local_b0 + *len_00;
                    for (; local_b0 < pbVar5; local_b0 = local_b0 + local_a8) {
                      iVar2 = mbedtls_asn1_get_tag(&local_b0,pbVar5,&local_a8,0x30);
                      if (iVar2 != 0) goto LAB_0011f98e;
                    }
                    if (local_b0 != pbVar5) {
                      iVar2 = -0x2566;
                      goto LAB_0011f677;
                    }
                  }
                  else if (iVar2 == -0x62) {
                    (pmVar6->entry_ext).p = (uchar *)0x0;
                  }
                  else {
LAB_0011f98e:
                    iVar2 = iVar2 + -0x2500;
                    if (iVar2 != 0) goto LAB_0011f677;
                  }
                }
                pbVar5 = local_b0;
              } while (local_90 <= local_b0);
              pmVar4 = (mbedtls_x509_crl_entry *)calloc(1,0x68);
              pmVar6->next = pmVar4;
              pmVar6 = pmVar4;
            } while (pmVar4 != (mbedtls_x509_crl_entry *)0x0);
            iVar2 = -0x2880;
          }
        }
      }
LAB_0011f677:
      mbedtls_x509_crl_free(crl);
      return iVar2;
    }
  }
  return -0x2880;
}

Assistant:

int mbedtls_x509_crl_parse_der( mbedtls_x509_crl *chain,
                        const unsigned char *buf, size_t buflen )
{
    int ret;
    size_t len;
    unsigned char *p = NULL, *end = NULL;
    mbedtls_x509_buf sig_params1, sig_params2, sig_oid2;
    mbedtls_x509_crl *crl = chain;

    /*
     * Check for valid input
     */
    if( crl == NULL || buf == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    memset( &sig_params1, 0, sizeof( mbedtls_x509_buf ) );
    memset( &sig_params2, 0, sizeof( mbedtls_x509_buf ) );
    memset( &sig_oid2, 0, sizeof( mbedtls_x509_buf ) );

    /*
     * Add new CRL on the end of the chain if needed.
     */
    while( crl->version != 0 && crl->next != NULL )
        crl = crl->next;

    if( crl->version != 0 && crl->next == NULL )
    {
        crl->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crl ) );

        if( crl->next == NULL )
        {
            mbedtls_x509_crl_free( crl );
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );
        }

        mbedtls_x509_crl_init( crl->next );
        crl = crl->next;
    }

    /*
     * Copy raw DER-encoded CRL
     */
    if( buflen == 0 )
        return( MBEDTLS_ERR_X509_INVALID_FORMAT );

    p = mbedtls_calloc( 1, buflen );
    if( p == NULL )
        return( MBEDTLS_ERR_X509_ALLOC_FAILED );

    memcpy( p, buf, buflen );

    crl->raw.p = p;
    crl->raw.len = buflen;

    end = p + buflen;

    /*
     * CertificateList  ::=  SEQUENCE  {
     *      tbsCertList          TBSCertList,
     *      signatureAlgorithm   AlgorithmIdentifier,
     *      signatureValue       BIT STRING  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT );
    }

    if( len != (size_t) ( end - p ) )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    /*
     * TBSCertList  ::=  SEQUENCE  {
     */
    crl->tbs.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    end = p + len;
    crl->tbs.len = end - crl->tbs.p;

    /*
     * Version  ::=  INTEGER  OPTIONAL {  v1(0), v2(1)  }
     *               -- if present, MUST be v2
     *
     * signature            AlgorithmIdentifier
     */
    if( ( ret = x509_crl_get_version( &p, end, &crl->version ) ) != 0 ||
        ( ret = mbedtls_x509_get_alg( &p, end, &crl->sig_oid, &sig_params1 ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( crl->version < 0 || crl->version > 1 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_UNKNOWN_VERSION );
    }

    crl->version++;

    if( ( ret = mbedtls_x509_get_sig_alg( &crl->sig_oid, &sig_params1,
                                  &crl->sig_md, &crl->sig_pk,
                                  &crl->sig_opts ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG );
    }

    /*
     * issuer               Name
     */
    crl->issuer_raw.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    if( ( ret = mbedtls_x509_get_name( &p, p + len, &crl->issuer ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    crl->issuer_raw.len = p - crl->issuer_raw.p;

    /*
     * thisUpdate          Time
     * nextUpdate          Time OPTIONAL
     */
    if( ( ret = mbedtls_x509_get_time( &p, end, &crl->this_update ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( ( ret = mbedtls_x509_get_time( &p, end, &crl->next_update ) ) != 0 )
    {
        if( ret != ( MBEDTLS_ERR_X509_INVALID_DATE +
                        MBEDTLS_ERR_ASN1_UNEXPECTED_TAG ) &&
            ret != ( MBEDTLS_ERR_X509_INVALID_DATE +
                        MBEDTLS_ERR_ASN1_OUT_OF_DATA ) )
        {
            mbedtls_x509_crl_free( crl );
            return( ret );
        }
    }

    /*
     * revokedCertificates    SEQUENCE OF SEQUENCE   {
     *      userCertificate        CertificateSerialNumber,
     *      revocationDate         Time,
     *      crlEntryExtensions     Extensions OPTIONAL
     *                                   -- if present, MUST be v2
     *                        } OPTIONAL
     */
    if( ( ret = x509_get_entries( &p, end, &crl->entry ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    /*
     * crlExtensions          EXPLICIT Extensions OPTIONAL
     *                              -- if present, MUST be v2
     */
    if( crl->version == 2 )
    {
        ret = x509_get_crl_ext( &p, end, &crl->crl_ext );

        if( ret != 0 )
        {
            mbedtls_x509_crl_free( crl );
            return( ret );
        }
    }

    if( p != end )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    end = crl->raw.p + crl->raw.len;

    /*
     *  signatureAlgorithm   AlgorithmIdentifier,
     *  signatureValue       BIT STRING
     */
    if( ( ret = mbedtls_x509_get_alg( &p, end, &sig_oid2, &sig_params2 ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( crl->sig_oid.len != sig_oid2.len ||
        memcmp( crl->sig_oid.p, sig_oid2.p, crl->sig_oid.len ) != 0 ||
        sig_params1.len != sig_params2.len ||
        ( sig_params1.len != 0 &&
          memcmp( sig_params1.p, sig_params2.p, sig_params1.len ) != 0 ) )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_SIG_MISMATCH );
    }

    if( ( ret = mbedtls_x509_get_sig( &p, end, &crl->sig ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( p != end )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    return( 0 );
}